

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O2

FxExpression * ParseParameter(FScanner *sc,PClassActor *cls,PType *type,bool constant)

{
  PName *pPVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  PClass *pPVar5;
  FxMultiNameState *this;
  FxConstant *pFVar6;
  FxFloatCast *this_00;
  FxBoolCast *this_01;
  FxIntCast *this_02;
  FxRuntimeStateIndex *this_03;
  FxExpression *pFVar7;
  size_t sVar8;
  char *pcVar9;
  FScriptPosition *this_04;
  undefined1 local_78 [20];
  FName local_64;
  FScriptPosition local_60;
  FSoundID local_4c;
  ExpVal local_48;
  FName local_34;
  
  this_04 = (FScriptPosition *)local_78;
  if ((PType *)TypeSound == type) {
    FScanner::MustGetString(sc);
    this = (FxMultiNameState *)FxExpression::operator_new((FxExpression *)0x38,(size_t)cls);
    local_4c.ID = S_FindSound(sc->String);
    FScriptPosition::FScriptPosition((FScriptPosition *)local_78,sc);
    FxConstant::FxConstant((FxConstant *)this,&local_4c,(FScriptPosition *)local_78);
  }
  else {
    if ((((PType *)TypeBool == type) || ((PType *)TypeSInt32 == type)) ||
       ((PType *)TypeFloat64 == type)) {
      pFVar7 = ParseExpression(sc,cls,constant);
      if ((constant) && (iVar3 = (*pFVar7->_vptr_FxExpression[3])(pFVar7), (char)iVar3 == '\0')) {
        pcVar9 = "Default parameter must be constant.";
        FScanner::ScriptMessage(sc,"Default parameter must be constant.");
        FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
        cls = (PClassActor *)pcVar9;
      }
      if ((PType *)TypeBool != type) {
        if ((PType *)TypeSInt32 != type) {
          this_00 = (FxFloatCast *)FxExpression::operator_new((FxExpression *)0x30,(size_t)cls);
          FxFloatCast::FxFloatCast(this_00,pFVar7);
          return &this_00->super_FxExpression;
        }
        this_02 = (FxIntCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)cls);
        FxIntCast::FxIntCast(this_02,pFVar7,true,false);
        return &this_02->super_FxExpression;
      }
      this_01 = (FxBoolCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)cls);
      FxBoolCast::FxBoolCast(this_01,pFVar7,true);
      return &this_01->super_FxExpression;
    }
    if (((PType *)TypeName == type) || ((PType *)TypeString == type)) {
      FScanner::SetEscape(sc,true);
      FScanner::MustGetString(sc);
      sVar8 = 0;
      FScanner::SetEscape(sc,false);
      pPVar1 = TypeName;
      this = (FxMultiNameState *)FxExpression::operator_new((FxExpression *)0x38,sVar8);
      if ((PType *)pPVar1 == type) {
        if (*sc->String == '\0') {
          local_64.Index = 0;
        }
        else {
          FName::FName(&local_64,sc->String);
        }
        FScriptPosition::FScriptPosition((FScriptPosition *)local_78,sc);
        FxConstant::FxConstant((FxConstant *)this,&local_64,(FScriptPosition *)local_78);
        this_04 = (FScriptPosition *)local_78;
      }
      else {
        strbin1((char *)&local_60);
        FScriptPosition::FScriptPosition((FScriptPosition *)local_78,sc);
        FxConstant::FxConstant((FxConstant *)this,&local_60.FileName,(FScriptPosition *)local_78);
        FString::~FString((FString *)local_78);
        this_04 = &local_60;
      }
    }
    else {
      if ((PType *)TypeColor == type) {
        FScanner::MustGetString(sc);
        pcVar9 = "none";
        bVar2 = FScanner::Compare(sc,"none");
        if (bVar2) {
          local_78._8_4_ = 0xffffffff;
        }
        else {
          pcVar9 = "";
          bVar2 = FScanner::Compare(sc,(char *)"");
          local_78._8_4_ = 0;
          if (!bVar2) {
            pcVar9 = (char *)sc;
            uVar4 = V_GetColor((DWORD *)0x0,sc);
            local_78._8_4_ = uVar4 & 0xffffff | 0x1000000;
          }
        }
        local_78._0_8_ = TypeColor;
        pFVar6 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pcVar9);
        ExpVal::ExpVal(&local_48,(ExpVal *)local_78);
        FScriptPosition::FScriptPosition(&local_60,sc);
        FxConstant::FxConstant(pFVar6,&local_48,&local_60);
        FString::~FString(&local_60.FileName);
        ExpVal::~ExpVal(&local_48);
        ExpVal::~ExpVal((ExpVal *)local_78);
        return &pFVar6->super_FxExpression;
      }
      if ((PType *)TypeStateLabel == type) {
        pcVar9 = (char *)0x102;
        bVar2 = FScanner::CheckToken(sc,0x102);
        if (!bVar2) {
          if (constant) {
            FScanner::MustGetToken(sc,0x102);
            return (FxExpression *)0x0;
          }
          this_03 = (FxRuntimeStateIndex *)
                    FxExpression::operator_new((FxExpression *)0x38,(size_t)pcVar9);
          pFVar7 = ParseExpression(sc,cls,false);
          FxRuntimeStateIndex::FxRuntimeStateIndex(this_03,pFVar7);
          return &this_03->super_FxExpression;
        }
        if (*sc->String != '\0') {
          pcVar9 = "None";
          bVar2 = FScanner::Compare(sc,"None");
          if (!bVar2) {
            pcVar9 = "*";
            bVar2 = FScanner::Compare(sc,"*");
            if (bVar2) {
              FScanner::ScriptError(sc,"Invalid state name \'*\'");
              return (FxExpression *)0x0;
            }
            this = (FxMultiNameState *)
                   FxExpression::operator_new((FxExpression *)0x40,(size_t)pcVar9);
            pcVar9 = sc->String;
            FScriptPosition::FScriptPosition((FScriptPosition *)local_78,sc);
            FxMultiNameState::FxMultiNameState(this,pcVar9,(FScriptPosition *)local_78);
            this_04 = (FScriptPosition *)local_78;
            goto LAB_0051fb7a;
          }
        }
        pFVar6 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pcVar9);
        FScriptPosition::FScriptPosition((FScriptPosition *)local_78,sc);
        FxConstant::FxConstant(pFVar6,0,(FScriptPosition *)local_78);
        FString::~FString((FString *)local_78);
        (pFVar6->super_FxExpression).ValueType = (PType *)TypeStateLabel;
        return &pFVar6->super_FxExpression;
      }
      pPVar5 = DObject::GetClass((DObject *)type);
      if (pPVar5 != PClassPointer::RegistrationInfo.MyClass) {
        __assert_fail("false && \"Unknown parameter type\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/decorate/thingdef_parse.cpp"
                      ,0xd3,"FxExpression *ParseParameter(FScanner &, PClassActor *, PType *, bool)"
                     );
      }
      FScanner::SetEscape(sc,true);
      FScanner::MustGetString(sc);
      sVar8 = 0;
      FScanner::SetEscape(sc,false);
      this = (FxMultiNameState *)FxExpression::operator_new((FxExpression *)0x38,sVar8);
      pFVar6 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,sVar8);
      FName::FName(&local_34,sc->String);
      FScriptPosition::FScriptPosition((FScriptPosition *)local_78,sc);
      FxConstant::FxConstant(pFVar6,&local_34,(FScriptPosition *)local_78);
      FxClassTypeCast::FxClassTypeCast
                ((FxClassTypeCast *)this,(PClassPointer *)type,(FxExpression *)pFVar6);
      this_04 = (FScriptPosition *)local_78;
    }
  }
LAB_0051fb7a:
  FString::~FString(&this_04->FileName);
  return &this->super_FxExpression;
}

Assistant:

FxExpression *ParseParameter(FScanner &sc, PClassActor *cls, PType *type, bool constant)
{
	FxExpression *x = NULL;
	int v;

	if (type == TypeSound)
	{
		sc.MustGetString();
		x = new FxConstant(FSoundID(sc.String), sc);
	}
	else if (type == TypeBool || type == TypeSInt32 || type == TypeFloat64)
	{
		x = ParseExpression (sc, cls, constant);
		if (constant && !x->isConstant())
		{
			sc.ScriptMessage("Default parameter must be constant.");
			FScriptPosition::ErrorCounter++;
		}
		// Do automatic coercion between bools, ints and floats.
		if (type == TypeBool)
		{
			x = new FxBoolCast(x);
		}
		else if (type == TypeSInt32)
		{
			x = new FxIntCast(x, true);
		}
		else
		{
			x = new FxFloatCast(x);
		}
	}
	else if (type == TypeName || type == TypeString)
	{
		sc.SetEscape(true);
		sc.MustGetString();
		sc.SetEscape(false);
		if (type == TypeName)
		{
			x = new FxConstant(sc.String[0] ? FName(sc.String) : NAME_None, sc);
		}
		else
		{
			x = new FxConstant(strbin1(sc.String), sc);
		}
	}
	else if (type == TypeColor)
	{
		sc.MustGetString ();
		if (sc.Compare("none"))
		{
			v = -1;
		}
		else if (sc.Compare(""))
		{
			v = 0;
		}
		else
		{
			int c = V_GetColor (NULL, sc);
			// 0 needs to be the default so we have to mark the color.
			v = MAKEARGB(1, RPART(c), GPART(c), BPART(c));
		}
		ExpVal val;
		val.Type = TypeColor;
		val.Int = v;
		x = new FxConstant(val, sc);
	}
	else if (type == TypeStateLabel)
	{
		// This forces quotation marks around the state name.
		if (sc.CheckToken(TK_StringConst))
		{
			if (sc.String[0] == 0 || sc.Compare("None"))
			{
				x = new FxConstant(0, sc);
				x->ValueType = TypeStateLabel;
			}
			else if (sc.Compare("*"))
			{
				sc.ScriptError("Invalid state name '*'");
			}
			else
			{
				x = new FxMultiNameState(sc.String, sc);
			}
		}
		else if (!constant)
		{
			x = new FxRuntimeStateIndex(ParseExpression(sc, cls));
		}
		else sc.MustGetToken(TK_StringConst); // This is for the error.
	}
	else if (type->GetClass() == RUNTIME_CLASS(PClassPointer))
	{	// Actor name
		sc.SetEscape(true);
		sc.MustGetString();
		sc.SetEscape(false);
		x = new FxClassTypeCast(static_cast<PClassPointer *>(type), new FxConstant(FName(sc.String), sc));
	}
	else
	{
		assert(false && "Unknown parameter type");
		x = NULL;
	}
	return x;
}